

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrIncr.c
# Opt level: O0

void IPdr_ManPrintClauses(Vec_Vec_t *vClauses,int kStart,int nRegs)

{
  int iVar1;
  Vec_Ptr_t *p;
  Pdr_Set_t *p_00;
  uint local_30;
  int Counter;
  int k;
  int i;
  Pdr_Set_t *pCube;
  Vec_Ptr_t *vArrayK;
  int nRegs_local;
  int kStart_local;
  Vec_Vec_t *vClauses_local;
  
  for (local_30 = kStart; iVar1 = Vec_VecSize(vClauses), (int)local_30 < iVar1;
      local_30 = local_30 + 1) {
    p = Vec_VecEntry(vClauses,local_30);
    Vec_PtrSort(p,Pdr_SetCompare);
    for (Counter = 0; iVar1 = Vec_PtrSize(p), Counter < iVar1; Counter = Counter + 1) {
      p_00 = (Pdr_Set_t *)Vec_PtrEntry(p,Counter);
      Abc_Print(1,"Frame[%4d]Cube[%4d] = ",(ulong)local_30);
      ZPdr_SetPrint(p_00);
      Abc_Print(1,"\n");
    }
  }
  return;
}

Assistant:

void IPdr_ManPrintClauses( Vec_Vec_t * vClauses, int kStart, int nRegs )
{
    Vec_Ptr_t * vArrayK;
    Pdr_Set_t * pCube;
    int i, k, Counter = 0;
    Vec_VecForEachLevelStart( vClauses, vArrayK, k, kStart )
    {
        Vec_PtrSort( vArrayK, (int (*)(void))Pdr_SetCompare );
        Vec_PtrForEachEntry( Pdr_Set_t *, vArrayK, pCube, i )
        {
            Abc_Print( 1, "Frame[%4d]Cube[%4d] = ", k, Counter++ );
            // Pdr_SetPrint( stdout, pCube, nRegs, NULL );  
            ZPdr_SetPrint( pCube );  
            Abc_Print( 1, "\n" ); 
        }
    }
}